

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::SetFontLanguageVariant(CTextRender *this,char *pLanguageFile)

{
  int iVar1;
  char *in_RDI;
  int i;
  char *pFamilyName;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  char *a;
  
  if (*(long *)(in_RDI + 0x38) != 0) {
    a = (char *)0x0;
    if (*(long *)(in_RDI + 200) != 0) {
      for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < *(int *)(in_RDI + 0xc0);
          in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
        iVar1 = str_comp_filenames(a,(char *)CONCAT44(in_stack_ffffffffffffffe4,
                                                      in_stack_ffffffffffffffe0));
        if (iVar1 == 0) {
          *(int *)(in_RDI + 0xc4) = in_stack_ffffffffffffffe4;
          break;
        }
      }
    }
    CGlyphMap::SetVariantFaceByName
              ((CGlyphMap *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI);
  }
  return;
}

Assistant:

void CTextRender::SetFontLanguageVariant(const char *pLanguageFile)
{
	if(!m_pGlyphMap)
		return;	

	char *pFamilyName = NULL;

	if(m_paVariants)
	{
		for(int i = 0; i < m_NumVariants; ++i)
		{
			if(str_comp_filenames(pLanguageFile, m_paVariants[i].m_aLanguageFile) == 0)
			{
				pFamilyName = m_paVariants[i].m_aFamilyName;
				m_CurrentVariant = i;
				break;
			}
		}
	}

	m_pGlyphMap->SetVariantFaceByName(pFamilyName);
}